

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BuildAndStoreBlockSwitchEntropyCodes
               (BlockEncoder *self,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *storage_local;
  size_t *storage_ix_local;
  HuffmanTree *tree_local;
  BlockEncoder *self_local;
  
  BuildAndStoreBlockSplitCode
            (self->block_types_,self->block_lengths_,self->num_blocks_,self->num_block_types_,tree,
             &self->block_split_code_,storage_ix,storage);
  return;
}

Assistant:

static void BuildAndStoreBlockSwitchEntropyCodes(BlockEncoder* self,
    HuffmanTree* tree, size_t* storage_ix, uint8_t* storage) {
  BuildAndStoreBlockSplitCode(self->block_types_, self->block_lengths_,
      self->num_blocks_, self->num_block_types_, tree, &self->block_split_code_,
      storage_ix, storage);
}